

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::CPhase
          (CPhase<std::complex<float>_> *this,int control,int target,angle_type *angle,
          int controlState)

{
  float fVar1;
  Phase<std::complex<float>_> *pPVar2;
  
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004ef260;
  pPVar2 = (Phase<std::complex<float>_> *)operator_new(0x18);
  (pPVar2->super_QGate1<std::complex<float>_>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/QGate1.hpp"
                  ,0x21,
                  "qclab::qgates::QGate1<std::complex<float>>::QGate1(const int) [T = std::complex<float>]"
                 );
  }
  (pPVar2->super_QGate1<std::complex<float>_>).field_0xc = 0;
  (pPVar2->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_> =
       (QObject<std::complex<float>_>)&PTR_nbQubits_004ebc10;
  fVar1 = angle->sin_;
  (pPVar2->angle_).cos_ = angle->cos_;
  (pPVar2->angle_).sin_ = fVar1;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_false>._M_head_impl = pPVar2;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                  ,0x32,
                  "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const angle_type &, const int) [T = std::complex<float>]"
                 );
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                ,0x31,
                "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const angle_type &, const int) [T = std::complex<float>]"
               );
}

Assistant:

CPhase( const int control , const int target , const angle_type& angle ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , angle ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }